

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.hpp
# Opt level: O1

void __thiscall
duckdb::CorrelatedColumnInfo::CorrelatedColumnInfo
          (CorrelatedColumnInfo *this,BoundColumnRefExpression *expr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  idx_t iVar2;
  _Alloc_hider local_60;
  size_type local_58;
  char local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  LogicalType local_40;
  idx_t local_28;
  idx_t iStack_20;
  
  local_28 = (expr->binding).table_index;
  iStack_20 = (expr->binding).column_index;
  LogicalType::LogicalType(&local_40,&(expr->super_Expression).return_type);
  (*(expr->super_Expression).super_BaseExpression._vptr_BaseExpression[7])(&local_60,expr);
  iVar2 = expr->depth;
  (this->binding).table_index = local_28;
  (this->binding).column_index = iStack_20;
  LogicalType::LogicalType(&this->type,&local_40);
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  if (local_60._M_p == &local_50) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_4f,local_50);
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uStack_48;
  }
  else {
    (this->name)._M_dataplus._M_p = local_60._M_p;
    (this->name).field_2._M_allocated_capacity = CONCAT71(uStack_4f,local_50);
  }
  (this->name)._M_string_length = local_58;
  local_58 = 0;
  local_50 = '\0';
  this->depth = iVar2;
  local_60._M_p = &local_50;
  LogicalType::~LogicalType(&local_40);
  return;
}

Assistant:

explicit CorrelatedColumnInfo(BoundColumnRefExpression &expr)
	    : CorrelatedColumnInfo(expr.binding, expr.return_type, expr.GetName(), expr.depth) {
	}